

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O2

int __thiscall zmq::plain_server_t::process_handshake_command(plain_server_t *this,msg_t *msg_)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  socket_base_t *this_00;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  EVP_PKEY_CTX *pEVar5;
  
  iVar1 = *(int *)&(this->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48;
  pEVar5 = (EVP_PKEY_CTX *)msg_;
  if (iVar1 == 2) {
    iVar1 = process_initiate(this,msg_);
  }
  else {
    if (iVar1 != 0) {
      this_00 = session_base_t::get_socket
                          (*(session_base_t **)
                            &(this->super_zap_client_common_handshake_t).field_0x5e0);
      endpoint_uri_pair_ =
           session_base_t::get_endpoint
                     (*(session_base_t **)&(this->super_zap_client_common_handshake_t).field_0x5e0);
      socket_base_t::event_handshake_failed_protocol(this_00,endpoint_uri_pair_,0x10000000);
      piVar3 = __errno_location();
      *piVar3 = 0x47;
      return -1;
    }
    iVar1 = process_hello(this,msg_);
  }
  if (iVar1 == 0) {
    iVar1 = msg_t::close(msg_,(int)pEVar5);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pEVar5 = (EVP_PKEY_CTX *)0x1dfbd5;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_server.cpp"
              ,0x6a);
      fflush(_stderr);
      zmq_abort(pcVar4);
    }
    iVar2 = msg_t::init(msg_,pEVar5);
    iVar1 = 0;
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_server.cpp"
              ,0x6c);
      fflush(_stderr);
      zmq_abort(pcVar4);
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int zmq::plain_server_t::process_handshake_command (msg_t *msg_)
{
    int rc = 0;

    switch (state) {
        case waiting_for_hello:
            rc = process_hello (msg_);
            break;
        case waiting_for_initiate:
            rc = process_initiate (msg_);
            break;
        default:
            //  TODO see comment in curve_server_t::process_handshake_command
            session->get_socket ()->event_handshake_failed_protocol (
              session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNSPECIFIED);
            errno = EPROTO;
            rc = -1;
            break;
    }
    if (rc == 0) {
        rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
    }
    return rc;
}